

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_scolumn_dfs.c
# Opt level: O2

int ilu_scolumn_dfs(int m,int jcol,int *perm_r,int *nseg,int *lsub_col,int *segrep,int *repfnz,
                   int *marker,int *parent,int_t *xplore,GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int_t iVar4;
  int iVar5;
  long lVar6;
  uint *puVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int_t *piVar11;
  long lVar12;
  int *piVar13;
  int_t *piVar14;
  int *piVar15;
  long lVar16;
  int *piVar17;
  int iVar18;
  ulong uVar19;
  int local_a4;
  int_t nzlmax;
  int local_98;
  int local_94;
  long local_90;
  long local_88;
  int local_7c;
  int *local_78;
  int *local_70;
  int_t *local_68;
  int *local_60;
  int *local_58;
  long local_50;
  ulong local_48;
  int *local_40;
  int *local_38;
  
  piVar15 = Glu->xsup;
  piVar13 = Glu->supno;
  piVar11 = Glu->lsub;
  piVar14 = Glu->xlsub;
  nzlmax = Glu->nzlmax;
  local_78 = lsub_col;
  local_58 = perm_r;
  local_40 = nseg;
  local_38 = segrep;
  local_7c = sp_ienv(7);
  local_94 = jcol + 1;
  iVar1 = jcol + -1;
  local_88 = (long)jcol;
  local_a4 = piVar13[local_88];
  local_50 = (long)local_a4;
  uVar10 = (ulong)(uint)piVar14[local_88];
  local_90 = 0;
  piVar17 = local_78;
  iVar18 = local_a4;
  local_98 = local_a4;
  local_70 = piVar15;
  local_68 = piVar14;
  local_60 = piVar13;
  do {
    iVar5 = piVar17[local_90];
    lVar6 = (long)iVar5;
    iVar8 = (int)uVar10;
    if (lVar6 == -1) {
      if (jcol == 0) {
        *piVar13 = 0;
        local_98 = 0;
      }
      else {
        iVar18 = piVar15[local_50];
        iVar5 = piVar14[local_88];
        if ((((local_7c <= jcol - iVar18) || (iVar8 == iVar5)) ||
            (iVar8 - iVar5 != ~piVar14[iVar1] + iVar5)) || (local_a4 == -1)) {
          if (iVar18 < iVar1) {
            iVar18 = piVar14[(long)iVar18 + 1];
            uVar10 = (ulong)iVar18;
            piVar14[iVar1] = iVar18;
            piVar14[local_88] = iVar18;
            for (lVar6 = (long)iVar5; lVar6 < iVar8; lVar6 = lVar6 + 1) {
              piVar11[uVar10] = piVar11[lVar6];
              uVar10 = uVar10 + 1;
            }
          }
          iVar8 = (int)uVar10;
          local_98 = local_98 + 1;
          piVar13[local_88] = local_98;
        }
      }
      piVar15[(long)local_98 + 1] = local_94;
      piVar13[local_94] = local_98;
      piVar14[local_94] = iVar8;
      return 0;
    }
    piVar17[local_90] = -1;
    iVar2 = marker[m * 2 + lVar6];
    if (iVar2 != jcol) {
      marker[m * 2 + lVar6] = jcol;
      iVar3 = local_58[lVar6];
      if ((long)iVar3 == -1) {
        uVar9 = iVar8 + 1;
        uVar10 = (ulong)uVar9;
        piVar11[iVar8] = iVar5;
        if (nzlmax <= (int)uVar9) {
          iVar4 = sLUMemXpand(jcol,uVar9,LSUB,&nzlmax,Glu);
          if (iVar4 != 0) {
            return iVar4;
          }
          piVar11 = Glu->lsub;
          piVar13 = local_60;
          piVar14 = local_68;
          piVar15 = local_70;
          iVar18 = local_a4;
        }
        local_a4 = iVar18;
        if (iVar2 != iVar1) {
          local_a4 = -1;
          iVar18 = -1;
        }
      }
      else {
        iVar5 = piVar15[(long)piVar13[iVar3] + 1];
        lVar6 = (long)iVar5;
        if (repfnz[lVar6 + -1] == -1) {
          lVar16 = lVar6 + -1;
          parent[lVar6 + -1] = -1;
          repfnz[lVar6 + -1] = iVar3;
          puVar7 = (uint *)(piVar14 + piVar15[piVar13[lVar6 + -1]]);
LAB_0010b3cb:
          iVar18 = piVar14[iVar5];
          uVar19 = (ulong)*puVar7;
LAB_0010b3d4:
          lVar6 = (long)(int)uVar19;
          do {
            iVar8 = (int)lVar16;
            if (iVar18 <= (int)lVar6) {
              local_38[*local_40] = iVar8;
              *local_40 = *local_40 + 1;
              lVar16 = (long)parent[iVar8];
              piVar17 = local_78;
              iVar18 = local_a4;
              if (lVar16 == -1) goto LAB_0010b546;
              puVar7 = (uint *)(xplore + lVar16);
              iVar5 = parent[iVar8] + 1;
              goto LAB_0010b3cb;
            }
            iVar5 = piVar11[lVar6];
            iVar2 = marker[(long)(m * 2) + (long)iVar5];
            if (iVar2 != jcol) {
              marker[(long)(m * 2) + (long)iVar5] = jcol;
              iVar3 = local_58[iVar5];
              if ((long)iVar3 == -1) goto LAB_0010b444;
              iVar5 = piVar15[(long)piVar13[iVar3] + 1];
              lVar12 = (long)iVar5;
              if (repfnz[lVar12 + -1] == -1) {
                lVar16 = lVar12 + -1;
                xplore[iVar8] = (int)lVar6 + 1;
                parent[lVar12 + -1] = iVar8;
                repfnz[lVar12 + -1] = iVar3;
                puVar7 = (uint *)(piVar14 + piVar15[piVar13[lVar12 + -1]]);
                goto LAB_0010b3cb;
              }
              if (iVar3 < repfnz[lVar12 + -1]) {
                repfnz[lVar12 + -1] = iVar3;
              }
            }
            lVar6 = lVar6 + 1;
          } while( true );
        }
        if (iVar3 < repfnz[lVar6 + -1]) {
          repfnz[lVar6 + -1] = iVar3;
        }
      }
    }
LAB_0010b546:
    local_90 = local_90 + 1;
  } while( true );
LAB_0010b444:
  uVar9 = (int)uVar10 + 1;
  piVar11[(int)uVar10] = iVar5;
  uVar10 = (ulong)uVar9;
  if (nzlmax <= (int)uVar9) {
    local_48 = (ulong)uVar9;
    iVar4 = sLUMemXpand(jcol,uVar9,LSUB,&nzlmax,Glu);
    if (iVar4 != 0) {
      return iVar4;
    }
    piVar11 = Glu->lsub;
    uVar10 = local_48;
    piVar13 = local_60;
    piVar14 = local_68;
    piVar15 = local_70;
  }
  uVar19 = lVar6 + 1;
  if (iVar2 != iVar1) {
    local_a4 = -1;
  }
  goto LAB_0010b3d4;
}

Assistant:

int
ilu_scolumn_dfs(
	   const int  m,	 /* in - number of rows in the matrix */
	   const int  jcol,	 /* in */
	   int	      *perm_r,	 /* in */
	   int	      *nseg,	 /* modified - with new segments appended */
	   int	      *lsub_col, /* in - defines the RHS vector to start the
				    dfs */
	   int	      *segrep,	 /* modified - with new segments appended */
	   int	      *repfnz,	 /* modified */
	   int	      *marker,	 /* modified */
	   int	      *parent,	 /* working array */
	   int_t      *xplore,	 /* working array */
	   GlobalLU_t *Glu	 /* modified */
	   )
{

    int     jcolp1, jcolm1, jsuper, nsuper;
    int     k, krep, krow, kmark, kperm;
    int     *marker2;		/* Used for small panel LU */
    int     fsupc;		/* First column of a snode */
    int     myfnz;		/* First nonz column of a U-segment */
    int     chperm, chmark, chrep, kchild, kpar, oldrep;
    int_t   xdfs, maxdfs; 
    int_t   jptr, jm1ptr;
    int_t   ito, ifrom; 	/* Used to compress row subscripts */
    int_t   mem_error, nextl;
    int     *xsup, *supno;
    int_t   *lsub, *xlsub;
    int_t   nzlmax;
    int     maxsuper;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    nzlmax  = Glu->nzlmax;

    maxsuper = sp_ienv(7);
    jcolp1  = jcol + 1;
    jcolm1  = jcol - 1;
    nsuper  = supno[jcol];
    jsuper  = nsuper;
    nextl   = xlsub[jcol];
    marker2 = &marker[2*m];


    /* For each nonzero in A[*,jcol] do dfs */
    for (k = 0; lsub_col[k] != SLU_EMPTY; k++) {

	krow = lsub_col[k];
	lsub_col[k] = SLU_EMPTY;
	kmark = marker2[krow];

	/* krow was visited before, go to the next nonzero */
	if ( kmark == jcol ) continue;

	/* For each unmarked nbr krow of jcol
	 *	krow is in L: place it in structure of L[*,jcol]
	 */
	marker2[krow] = jcol;
	kperm = perm_r[krow];

	if ( kperm == SLU_EMPTY ) {
	    lsub[nextl++] = krow;	/* krow is indexed into A */
	    if ( nextl >= nzlmax ) {
		if ((mem_error = sLUMemXpand(jcol, nextl, LSUB, &nzlmax, Glu)))
		    return (mem_error);
		lsub = Glu->lsub;
	    }
	    if ( kmark != jcolm1 ) jsuper = SLU_EMPTY;/* Row index subset testing */
	} else {
	    /*	krow is in U: if its supernode-rep krep
	     *	has been explored, update repfnz[*]
	     */
	    krep = xsup[supno[kperm]+1] - 1;
	    myfnz = repfnz[krep];

	    if ( myfnz != SLU_EMPTY ) {	/* Visited before */
		if ( myfnz > kperm ) repfnz[krep] = kperm;
		/* continue; */
	    }
	    else {
		/* Otherwise, perform dfs starting at krep */
		oldrep = SLU_EMPTY;
		parent[krep] = oldrep;
		repfnz[krep] = kperm;
		xdfs = xlsub[xsup[supno[krep]]];
		maxdfs = xlsub[krep + 1];

		do {
		    /*
		     * For each unmarked kchild of krep
		     */
		    while ( xdfs < maxdfs ) {

			kchild = lsub[xdfs];
			xdfs++;
			chmark = marker2[kchild];

			if ( chmark != jcol ) { /* Not reached yet */
			    marker2[kchild] = jcol;
			    chperm = perm_r[kchild];

			    /* Case kchild is in L: place it in L[*,k] */
			    if ( chperm == SLU_EMPTY ) {
				lsub[nextl++] = kchild;
				if ( nextl >= nzlmax ) {
				    if ( (mem_error = sLUMemXpand(jcol,nextl,
					    LSUB,&nzlmax,Glu)) )
					return (mem_error);
				    lsub = Glu->lsub;
				}
				if ( chmark != jcolm1 ) jsuper = SLU_EMPTY;
			    } else {
				/* Case kchild is in U:
				 *   chrep = its supernode-rep. If its rep has
				 *   been explored, update its repfnz[*]
				 */
				chrep = xsup[supno[chperm]+1] - 1;
				myfnz = repfnz[chrep];
				if ( myfnz != SLU_EMPTY ) { /* Visited before */
				    if ( myfnz > chperm )
					repfnz[chrep] = chperm;
				} else {
				    /* Continue dfs at super-rep of kchild */
				    xplore[krep] = xdfs;
				    oldrep = krep;
				    krep = chrep; /* Go deeper down G(L^t) */
				    parent[krep] = oldrep;
				    repfnz[krep] = chperm;
				    xdfs = xlsub[xsup[supno[krep]]];
				    maxdfs = xlsub[krep + 1];
				} /* else */

			   } /* else */

			} /* if */

		    } /* while */

		    /* krow has no more unexplored nbrs;
		     *	  place supernode-rep krep in postorder DFS.
		     *	  backtrack dfs to its parent
		     */
		    segrep[*nseg] = krep;
		    ++(*nseg);
		    kpar = parent[krep]; /* Pop from stack, mimic recursion */
		    if ( kpar == SLU_EMPTY ) break; /* dfs done */
		    krep = kpar;
		    xdfs = xplore[krep];
		    maxdfs = xlsub[krep + 1];

		} while ( kpar != SLU_EMPTY );	/* Until empty stack */

	    } /* else */

	} /* else */

    } /* for each nonzero ... */

    /* Check to see if j belongs in the same supernode as j-1 */
    if ( jcol == 0 ) { /* Do nothing for column 0 */
	nsuper = supno[0] = 0;
    } else {
	fsupc = xsup[nsuper];
	jptr = xlsub[jcol];	/* Not compressed yet */
	jm1ptr = xlsub[jcolm1];

	if ( (nextl-jptr != jptr-jm1ptr-1) ) jsuper = SLU_EMPTY;

	/* Always start a new supernode for a singular column */
	if ( nextl == jptr ) jsuper = SLU_EMPTY;

	/* Make sure the number of columns in a supernode doesn't
	   exceed threshold. */
	if ( jcol - fsupc >= maxsuper ) jsuper = SLU_EMPTY;

	/* If jcol starts a new supernode, reclaim storage space in
	 * lsub from the previous supernode. Note we only store
	 * the subscript set of the first columns of the supernode.
	 */
	if ( jsuper == SLU_EMPTY ) {	/* starts a new supernode */
	    if ( (fsupc < jcolm1) ) { /* >= 2 columns in nsuper */
#ifdef CHK_COMPRESS
		printf("  Compress lsub[] at super %d-%d\n", fsupc, jcolm1);
#endif
		ito = xlsub[fsupc+1];
		xlsub[jcolm1] = ito;
		xlsub[jcol] = ito;
		for (ifrom = jptr; ifrom < nextl; ++ifrom, ++ito)
		    lsub[ito] = lsub[ifrom];
		nextl = ito;
	    }
	    nsuper++;
	    supno[jcol] = nsuper;
	} /* if a new supernode */

    }	/* else: jcol > 0 */

    /* Tidy up the pointers before exit */
    xsup[nsuper+1] = jcolp1;
    supno[jcolp1]  = nsuper;
    xlsub[jcolp1]  = nextl;

    return 0;
}